

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O1

void __thiscall bsplib::Rdma::sync(Rdma *this)

{
  ActionBuf *this_00;
  pointer puVar1;
  pointer puVar2;
  pointer pPVar3;
  pointer ppvVar4;
  long lVar5;
  uint in_ESI;
  long lVar6;
  Rdma *__stat_loc;
  
  (this->m_send_actions).m_dummy_bsmp = in_ESI;
  lVar5 = (long)(this->m_second_exchange).m_nprocs;
  if (0 < lVar5) {
    puVar1 = (this->m_second_exchange).m_send_sizes.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->m_send_actions).m_get_buffer_offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      puVar2[lVar6] = puVar1[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  PushPopCommBuf::serialize(&this->m_send_push_pop_comm_buf,&this->m_first_exchange);
  ActionBuf::serialize(&this->m_send_actions,&this->m_first_exchange);
  A2A::exchange(&this->m_first_exchange);
  PushPopCommBuf::deserialize(&this->m_recv_push_pop_comm_buf,&this->m_first_exchange);
  this_00 = &this->m_recv_actions;
  ActionBuf::deserialize(this_00,&this->m_first_exchange);
  __stat_loc = this;
  ActionBuf::execute(this_00,this);
  Unbuf::start(&this->m_unbuf);
  A2A::exchange(&this->m_second_exchange);
  write_gets(this);
  write_puts(this);
  Unbuf::wait(&this->m_unbuf,__stat_loc);
  PushPopCommBuf::execute(&this->m_recv_push_pop_comm_buf,this);
  pPVar3 = (this->m_send_push_pop_comm_buf).m_pushed_slots.
           super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_send_push_pop_comm_buf).m_pushed_slots.
      super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar3) {
    (this->m_send_push_pop_comm_buf).m_pushed_slots.
    super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar3;
  }
  puVar1 = (this->m_send_push_pop_comm_buf).m_popped_slots.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_send_push_pop_comm_buf).m_popped_slots.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_send_push_pop_comm_buf).m_popped_slots.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pPVar3 = (this->m_recv_push_pop_comm_buf).m_pushed_slots.
           super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_recv_push_pop_comm_buf).m_pushed_slots.
      super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar3) {
    (this->m_recv_push_pop_comm_buf).m_pushed_slots.
    super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar3;
  }
  puVar1 = (this->m_recv_push_pop_comm_buf).m_popped_slots.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_recv_push_pop_comm_buf).m_popped_slots.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_recv_push_pop_comm_buf).m_popped_slots.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  ActionBuf::clear(&this->m_send_actions);
  ActionBuf::clear(this_00);
  ppvVar4 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar4) {
    (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar4;
  }
  return;
}

Assistant:

bool Rdma::sync(bool dummy_bsmp)
{
    m_send_actions.set_dummy_bsmp(dummy_bsmp);
    m_send_actions.set_get_buffer_offset( m_second_exchange );

    // first exchange: gets, unbuffered requests, push/pop registers
    m_send_push_pop_comm_buf.serialize( m_first_exchange );
    m_send_actions.serialize( m_first_exchange );
   
    m_first_exchange.exchange( );

    m_recv_push_pop_comm_buf.deserialize( m_first_exchange );
    m_recv_actions.deserialize( m_first_exchange );
   
    m_recv_actions.execute(*this);
    
    // start the unbuffered requests
    m_unbuf.start();

    // perform the buffered puts (which includes the buffered gets)
    m_second_exchange.exchange( );
    write_gets();
    write_puts() ;

    // wait for the unbuffered requests to finish
    m_unbuf.wait();

    // execute the push/pop registers
    m_recv_push_pop_comm_buf.execute(*this);

    bool all_dummy_bsmp = m_recv_actions.get_dummy_bsmp();
    // reset to initial state
    m_send_push_pop_comm_buf.clear();
    m_recv_push_pop_comm_buf.clear();
    m_send_actions.clear();
    m_recv_actions.clear();
    m_local_slots.clear();
    return all_dummy_bsmp;
}